

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O2

void pzshape::TPZShapeTetra::TransformDerivativeFromRibToTetra
               (int rib,int num,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  ulong col;
  
  lVar4 = (long)rib * 0x18;
  col = 0;
  uVar5 = (ulong)(uint)num;
  if (num < 1) {
    uVar5 = col;
  }
  for (; uVar5 != col; col = col + 1) {
    dVar1 = *(double *)(gRibTrans3dTetra1d + lVar4 + 0x10);
    pdVar3 = TPZFMatrix<double>::operator()(dphi,0,col);
    dVar2 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(dphi,2,col);
    *pdVar3 = dVar1 * dVar2;
    dVar1 = *(double *)(gRibTrans3dTetra1d + lVar4 + 8);
    pdVar3 = TPZFMatrix<double>::operator()(dphi,0,col);
    dVar2 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(dphi,1,col);
    *pdVar3 = dVar1 * dVar2;
    dVar1 = *(double *)(gRibTrans3dTetra1d + lVar4);
    pdVar3 = TPZFMatrix<double>::operator()(dphi,0,col);
    dVar2 = *pdVar3;
    pdVar3 = TPZFMatrix<double>::operator()(dphi,0,col);
    *pdVar3 = dVar1 * dVar2;
  }
  return;
}

Assistant:

void TPZShapeTetra::TransformDerivativeFromRibToTetra(int rib,int num,TPZFMatrix<REAL> &dphi) {
		for (int j = 0;j<num;j++) {
			dphi(2,j) = gRibTrans3dTetra1d[rib][2]*dphi(0,j);
			dphi(1,j) = gRibTrans3dTetra1d[rib][1]*dphi(0,j);
			dphi(0,j) = gRibTrans3dTetra1d[rib][0]*dphi(0,j);
		}
	}